

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  uint uVar1;
  long lVar2;
  int local_c;
  
  local_c = n;
  if ((this->IDStack).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
  }
  uVar1 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar2 = 0;
  do {
    uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar2) ^ uVar1 & 0xff];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return ~uVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_S32, (intptr_t)n);
#endif
    return id;
}